

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-knowledge.c
# Opt level: O1

wchar_t a_cmp_tval(void *a,void *b)

{
  wchar_t wVar1;
  
  wVar1 = obj_group_order[a_info[*a].tval] - obj_group_order[a_info[*b].tval];
  if (wVar1 == L'\0') {
    wVar1 = a_info[*a].sval - a_info[*b].sval;
    if (wVar1 == L'\0') {
      wVar1 = strcmp(a_info[*a].name,a_info[*b].name);
      return wVar1;
    }
  }
  return wVar1;
}

Assistant:

static int a_cmp_tval(const void *a, const void *b)
{
	const int a_val = *(const int *)a;
	const int b_val = *(const int *)b;
	const struct artifact *a_a = &a_info[a_val];
	const struct artifact *a_b = &a_info[b_val];

	/* Group by */
	int ta = obj_group_order[a_a->tval];
	int tb = obj_group_order[a_b->tval];
	int c = ta - tb;
	if (c) return c;

	/* Order by */
	c = a_a->sval - a_b->sval;
	if (c) return c;
	return strcmp(a_a->name, a_b->name);
}